

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  int iVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar94;
  undefined4 uVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [32];
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar101 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1390 [16];
  Geometry *local_1380;
  long local_1378;
  long local_1370;
  ulong local_1368;
  RTCFilterFunctionNArguments local_1360;
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  RTCHitN local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar41 [16];
  
  pauVar34 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_12e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar110 = ZEXT1664(local_12e0);
  local_12f0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar111 = ZEXT1664(local_12f0);
  local_1300 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar112 = ZEXT1664(local_1300);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar100 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar105 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1310 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar94 * 0.99999964)));
  auVar113 = ZEXT1664(local_1310);
  local_1320 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar100 * 0.99999964)));
  auVar114 = ZEXT1664(local_1320);
  local_1330 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar105 * 0.99999964)));
  auVar115 = ZEXT1664(local_1330);
  fVar94 = fVar94 * 1.0000004;
  fVar100 = fVar100 * 1.0000004;
  fVar105 = fVar105 * 1.0000004;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1368 = uVar33 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_12c0._4_4_ = iVar1;
  local_12c0._0_4_ = iVar1;
  local_12c0._8_4_ = iVar1;
  local_12c0._12_4_ = iVar1;
  auVar109 = ZEXT1664(local_12c0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar84 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_12d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar97 = fVar94;
  fVar98 = fVar94;
  fVar99 = fVar94;
  fVar102 = fVar100;
  fVar103 = fVar100;
  fVar104 = fVar100;
  fVar106 = fVar105;
  fVar107 = fVar105;
  fVar108 = fVar105;
  local_12b0 = fVar105;
  fStack_12ac = fVar105;
  fStack_12a8 = fVar105;
  fStack_12a4 = fVar105;
  local_12a0 = fVar100;
  fStack_129c = fVar100;
  fStack_1298 = fVar100;
  fStack_1294 = fVar100;
  local_1290 = fVar94;
  fStack_128c = fVar94;
  fStack_1288 = fVar94;
  fStack_1284 = fVar94;
LAB_01cd57fb:
  do {
    do {
      if (pauVar34 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar24 = pauVar34 + -1;
      pauVar34 = pauVar34 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar24 + 8));
    uVar36 = *(size_t *)*pauVar34;
    while ((uVar36 & 8) == 0) {
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar33),auVar110._0_16_);
      auVar38 = vmulps_avx512vl(auVar113._0_16_,auVar38);
      auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar31),auVar111._0_16_);
      auVar39 = vmulps_avx512vl(auVar114._0_16_,auVar39);
      auVar38 = vmaxps_avx(auVar38,auVar39);
      auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar30),auVar112._0_16_);
      auVar39 = vmulps_avx512vl(auVar115._0_16_,auVar39);
      auVar39 = vmaxps_avx(auVar39,auVar109._0_16_);
      auVar38 = vmaxps_avx(auVar38,auVar39);
      auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + local_1368),auVar110._0_16_);
      auVar40._0_4_ = fVar94 * auVar39._0_4_;
      auVar40._4_4_ = fVar97 * auVar39._4_4_;
      auVar40._8_4_ = fVar98 * auVar39._8_4_;
      auVar40._12_4_ = fVar99 * auVar39._12_4_;
      auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar31 ^ 0x10)),
                                auVar111._0_16_);
      auVar41._0_4_ = fVar100 * auVar39._0_4_;
      auVar41._4_4_ = fVar102 * auVar39._4_4_;
      auVar41._8_4_ = fVar103 * auVar39._8_4_;
      auVar41._12_4_ = fVar104 * auVar39._12_4_;
      auVar39 = vminps_avx(auVar40,auVar41);
      auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar30 ^ 0x10)),
                                auVar112._0_16_);
      auVar86._0_4_ = fVar105 * auVar40._0_4_;
      auVar86._4_4_ = fVar106 * auVar40._4_4_;
      auVar86._8_4_ = fVar107 * auVar40._8_4_;
      auVar86._12_4_ = fVar108 * auVar40._12_4_;
      auVar40 = vminps_avx(auVar86,auVar84._0_16_);
      auVar39 = vminps_avx(auVar39,auVar40);
      uVar37 = vcmpps_avx512vl(auVar38,auVar39,2);
      local_1180._0_16_ = auVar38;
      if ((char)uVar37 == '\0') goto LAB_01cd57fb;
      uVar35 = uVar36 & 0xfffffffffffffff0;
      lVar18 = 0;
      for (uVar36 = uVar37; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar36 = *(ulong *)(uVar35 + lVar18 * 8);
      uVar27 = (uint)uVar37 - 1 & (uint)uVar37;
      uVar37 = (ulong)uVar27;
      if (uVar27 != 0) {
        uVar28 = *(uint *)(local_1180 + lVar18 * 4);
        lVar18 = 0;
        for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar29 = (ulong)uVar27;
        uVar37 = *(ulong *)(uVar35 + lVar18 * 8);
        uVar32 = *(uint *)(local_1180 + lVar18 * 4);
        if (uVar27 == 0) {
          if (uVar28 < uVar32) {
            *(ulong *)*pauVar34 = uVar37;
            *(uint *)((long)*pauVar34 + 8) = uVar32;
            pauVar34 = pauVar34 + 1;
          }
          else {
            *(ulong *)*pauVar34 = uVar36;
            *(uint *)((long)*pauVar34 + 8) = uVar28;
            pauVar34 = pauVar34 + 1;
            uVar36 = uVar37;
          }
        }
        else {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar36;
          auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar28));
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar37;
          auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar32));
          lVar18 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          uVar36 = (ulong)uVar27;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)(uVar35 + lVar18 * 8);
          auVar85 = vpunpcklqdq_avx(auVar85,ZEXT416(*(uint *)(local_1180 + lVar18 * 4)));
          auVar40 = vpshufd_avx(auVar38,0xaa);
          auVar41 = vpshufd_avx(auVar39,0xaa);
          auVar86 = vpshufd_avx(auVar85,0xaa);
          if (uVar27 == 0) {
            uVar36 = vpcmpgtd_avx512vl(auVar41,auVar40);
            uVar36 = uVar36 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar39,auVar38);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar42._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar42._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar42._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar40._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar42._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar40._12_4_;
            auVar39 = vmovdqa32_avx512vl(auVar39);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar43._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar43._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
            auVar38 = vpshufd_avx(auVar42,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar86,auVar38);
            uVar37 = uVar37 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar85,auVar42);
            bVar10 = (bool)((byte)uVar37 & 1);
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar36 = CONCAT44((uint)bVar11 * auVar39._4_4_ | (uint)!bVar11 * auVar38._4_4_,
                              (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_);
            auVar38 = vmovdqa32_avx512vl(auVar85);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar44._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar42._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar42._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar42._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar44._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar42._12_4_;
            auVar38 = vpshufd_avx(auVar44,0xaa);
            auVar39 = vpshufd_avx(auVar43,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar38,auVar39);
            uVar37 = uVar37 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar44,auVar43);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar45._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar45._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar44);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar46._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar43._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar43._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar43._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar46._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar43._12_4_;
            *pauVar34 = auVar46;
            pauVar34[1] = auVar45;
            pauVar34 = pauVar34 + 2;
          }
          else {
            lVar18 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            uVar27 = *(uint *)(local_1180 + lVar18 * 4);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)(uVar35 + lVar18 * 8);
            auVar50 = vpunpcklqdq_avx(auVar90,ZEXT416(uVar27));
            uVar36 = vpcmpgtd_avx512vl(auVar41,auVar40);
            uVar36 = uVar36 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar39,auVar38);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar47._0_4_ = (uint)bVar10 * auVar41._0_4_ | (uint)!bVar10 * auVar40._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar40._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar47._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar40._12_4_;
            auVar39 = vmovdqa32_avx512vl(auVar39);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar48._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar48._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
            auVar87._4_4_ = uVar27;
            auVar87._0_4_ = uVar27;
            auVar87._8_4_ = uVar27;
            auVar87._12_4_ = uVar27;
            uVar36 = vpcmpgtd_avx512vl(auVar87,auVar86);
            uVar36 = uVar36 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar50,auVar85);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar49._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * uVar27;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * uVar27;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * uVar27;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar49._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * uVar27;
            auVar38 = vmovdqa32_avx512vl(auVar50);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar50._0_4_ = (uint)bVar10 * auVar38._0_4_ | (uint)!bVar10 * auVar85._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar85._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar85._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar50._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar85._12_4_;
            auVar38 = vpshufd_avx(auVar50,0xaa);
            auVar39 = vpshufd_avx(auVar48,0xaa);
            uVar36 = vpcmpgtd_avx512vl(auVar38,auVar39);
            uVar36 = uVar36 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar50,auVar48);
            bVar10 = (bool)((byte)uVar36 & 1);
            auVar51._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * auVar38._0_4_;
            bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar38._4_4_;
            bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar38._8_4_;
            bVar10 = SUB81(uVar36 >> 3,0);
            auVar51._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar38._12_4_;
            auVar40 = vmovdqa32_avx512vl(auVar50);
            bVar10 = (bool)((byte)uVar36 & 1);
            bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
            bVar15 = SUB81(uVar36 >> 3,0);
            auVar38 = vpshufd_avx(auVar49,0xaa);
            auVar39 = vpshufd_avx(auVar47,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar38,auVar39);
            uVar37 = uVar37 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar49,auVar47);
            bVar11 = (bool)((byte)uVar37 & 1);
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar36 = CONCAT44((uint)bVar13 * auVar39._4_4_ | (uint)!bVar13 * auVar38._4_4_,
                              (uint)bVar11 * auVar39._0_4_ | (uint)!bVar11 * auVar38._0_4_);
            auVar38 = vmovdqa32_avx512vl(auVar49);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar52._0_4_ = (uint)bVar11 * auVar38._0_4_ | !bVar11 * auVar47._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar11 * auVar38._4_4_ | !bVar11 * auVar47._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar11 * auVar38._8_4_ | !bVar11 * auVar47._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar52._12_4_ = (uint)bVar11 * auVar38._12_4_ | !bVar11 * auVar47._12_4_;
            auVar38 = vpshufd_avx(auVar52,0xaa);
            auVar39 = vpshufd_avx(auVar51,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar39,auVar38);
            uVar37 = uVar37 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar51,auVar52);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar53._0_4_ = (uint)bVar11 * auVar39._0_4_ | (uint)!bVar11 * auVar38._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar11 * auVar39._4_4_ | (uint)!bVar11 * auVar38._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar11 * auVar39._8_4_ | (uint)!bVar11 * auVar38._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar53._12_4_ = (uint)bVar11 * auVar39._12_4_ | (uint)!bVar11 * auVar38._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar51);
            bVar11 = (bool)((byte)uVar37 & 1);
            auVar54._0_4_ = (uint)bVar11 * auVar38._0_4_ | !bVar11 * auVar52._0_4_;
            bVar11 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar11 * auVar38._4_4_ | !bVar11 * auVar52._4_4_;
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar11 * auVar38._8_4_ | !bVar11 * auVar52._8_4_;
            bVar11 = SUB81(uVar37 >> 3,0);
            auVar54._12_4_ = (uint)bVar11 * auVar38._12_4_ | !bVar11 * auVar52._12_4_;
            *(uint *)*pauVar34 = (uint)bVar10 * auVar40._0_4_ | !bVar10 * auVar48._0_4_;
            *(uint *)((long)*pauVar34 + 4) = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar48._4_4_;
            *(uint *)((long)*pauVar34 + 8) = (uint)bVar14 * auVar40._8_4_ | !bVar14 * auVar48._8_4_;
            *(uint *)((long)*pauVar34 + 0xc) =
                 (uint)bVar15 * auVar40._12_4_ | !bVar15 * auVar48._12_4_;
            pauVar34[1] = auVar54;
            pauVar34[2] = auVar53;
            pauVar34 = pauVar34 + 3;
          }
        }
      }
    }
    local_1378 = (ulong)((uint)uVar36 & 0xf) - 8;
    uVar36 = uVar36 & 0xfffffffffffffff0;
    for (local_1370 = 0; local_1370 != local_1378; local_1370 = local_1370 + 1) {
      lVar25 = local_1370 * 0x60;
      pSVar3 = context->scene;
      ppfVar4 = (pSVar3->vertices).items;
      pfVar5 = ppfVar4[*(uint *)(uVar36 + 0x48 + lVar25)];
      auVar77._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x28 + lVar25));
      auVar77._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 8 + lVar25));
      pfVar6 = ppfVar4[*(uint *)(uVar36 + 0x40 + lVar25)];
      auVar58._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x20 + lVar25));
      auVar58._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + lVar25));
      pfVar7 = ppfVar4[*(uint *)(uVar36 + 0x4c + lVar25)];
      auVar59._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x2c + lVar25));
      auVar59._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0xc + lVar25));
      pfVar8 = ppfVar4[*(uint *)(uVar36 + 0x44 + lVar25)];
      auVar65._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x24 + lVar25));
      auVar65._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 4 + lVar25));
      lVar18 = uVar36 + 0x40 + lVar25;
      local_fc0 = *(undefined8 *)(lVar18 + 0x10);
      uStack_fb8 = *(undefined8 *)(lVar18 + 0x18);
      uStack_fb0 = local_fc0;
      uStack_fa8 = uStack_fb8;
      lVar18 = uVar36 + 0x50 + lVar25;
      local_1240 = *(undefined8 *)(lVar18 + 0x10);
      uStack_1238 = *(undefined8 *)(lVar18 + 0x18);
      auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar25)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x18 + lVar25)));
      auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x10 + lVar25)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x18 + lVar25)));
      auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x14 + lVar25)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x1c + lVar25)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x14 + lVar25)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x1c + lVar25)));
      auVar86 = vunpcklps_avx(auVar38,auVar39);
      auVar85 = vunpcklps_avx(auVar40,auVar41);
      auVar38 = vunpckhps_avx(auVar40,auVar41);
      auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x30 + lVar25)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x38 + lVar25)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x30 + lVar25)),
                              *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x38 + lVar25)));
      auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x34 + lVar25)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x3c + lVar25)));
      auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar36 + 0x34 + lVar25)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar36 + 0x3c + lVar25)));
      auVar40 = vunpcklps_avx(auVar39,auVar40);
      auVar47 = vunpcklps_avx(auVar41,auVar50);
      auVar39 = vunpckhps_avx(auVar41,auVar50);
      uStack_1230 = local_1240;
      uStack_1228 = uStack_1238;
      auVar78 = vunpcklps_avx(auVar65,auVar59);
      auVar75 = vunpcklps_avx(auVar58,auVar77);
      auVar76 = vunpcklps_avx(auVar75,auVar78);
      auVar75 = vunpckhps_avx(auVar75,auVar78);
      auVar78 = vunpckhps_avx(auVar65,auVar59);
      auVar77 = vunpckhps_avx(auVar58,auVar77);
      auVar77 = vunpcklps_avx(auVar77,auVar78);
      auVar61._16_16_ = auVar85;
      auVar61._0_16_ = auVar85;
      auVar64._16_16_ = auVar38;
      auVar64._0_16_ = auVar38;
      auVar62._16_16_ = auVar86;
      auVar62._0_16_ = auVar86;
      auVar66._16_16_ = auVar47;
      auVar66._0_16_ = auVar47;
      auVar67._16_16_ = auVar39;
      auVar67._0_16_ = auVar39;
      uVar95 = *(undefined4 *)(ray + k * 4);
      auVar68._4_4_ = uVar95;
      auVar68._0_4_ = uVar95;
      auVar68._8_4_ = uVar95;
      auVar68._12_4_ = uVar95;
      auVar68._16_4_ = uVar95;
      auVar68._20_4_ = uVar95;
      auVar68._24_4_ = uVar95;
      auVar68._28_4_ = uVar95;
      auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar95 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar88._4_4_ = uVar95;
      auVar88._0_4_ = uVar95;
      auVar88._8_4_ = uVar95;
      auVar88._12_4_ = uVar95;
      auVar88._16_4_ = uVar95;
      auVar88._20_4_ = uVar95;
      auVar88._24_4_ = uVar95;
      auVar88._28_4_ = uVar95;
      auVar63._16_16_ = auVar40;
      auVar63._0_16_ = auVar40;
      uVar95 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar92._4_4_ = uVar95;
      auVar92._0_4_ = uVar95;
      auVar92._8_4_ = uVar95;
      auVar92._12_4_ = uVar95;
      auVar92._16_4_ = uVar95;
      auVar92._20_4_ = uVar95;
      auVar92._24_4_ = uVar95;
      auVar92._28_4_ = uVar95;
      fVar94 = *(float *)(ray + k * 4 + 0x60);
      auVar101._4_4_ = fVar94;
      auVar101._0_4_ = fVar94;
      auVar101._8_4_ = fVar94;
      auVar101._12_4_ = fVar94;
      auVar101._16_4_ = fVar94;
      auVar101._20_4_ = fVar94;
      auVar101._24_4_ = fVar94;
      auVar101._28_4_ = fVar94;
      auVar78 = vsubps_avx(auVar76,auVar68);
      auVar58 = vsubps_avx512vl(auVar75,auVar56);
      auVar59 = vsubps_avx512vl(auVar77,auVar57);
      auVar60 = vsubps_avx512vl(auVar61,auVar68);
      auVar61 = vsubps_avx512vl(auVar64,auVar56);
      auVar62 = vsubps_avx512vl(auVar62,auVar57);
      auVar75 = vsubps_avx(auVar66,auVar68);
      auVar56 = vsubps_avx512vl(auVar67,auVar56);
      auVar57 = vsubps_avx512vl(auVar63,auVar57);
      auVar77 = vsubps_avx(auVar75,auVar78);
      auVar76 = vsubps_avx(auVar56,auVar58);
      auVar63 = vsubps_avx512vl(auVar57,auVar59);
      auVar64 = vsubps_avx512vl(auVar78,auVar60);
      auVar65 = vsubps_avx512vl(auVar58,auVar61);
      auVar66 = vsubps_avx512vl(auVar59,auVar62);
      auVar67 = vsubps_avx512vl(auVar60,auVar75);
      auVar68 = vsubps_avx512vl(auVar61,auVar56);
      auVar69 = vsubps_avx512vl(auVar62,auVar57);
      auVar73._0_4_ = auVar75._0_4_ + auVar78._0_4_;
      auVar73._4_4_ = auVar75._4_4_ + auVar78._4_4_;
      auVar73._8_4_ = auVar75._8_4_ + auVar78._8_4_;
      auVar73._12_4_ = auVar75._12_4_ + auVar78._12_4_;
      auVar73._16_4_ = auVar75._16_4_ + auVar78._16_4_;
      auVar73._20_4_ = auVar75._20_4_ + auVar78._20_4_;
      auVar73._24_4_ = auVar75._24_4_ + auVar78._24_4_;
      auVar73._28_4_ = auVar75._28_4_ + auVar78._28_4_;
      auVar91._0_4_ = auVar56._0_4_ + auVar58._0_4_;
      auVar91._4_4_ = auVar56._4_4_ + auVar58._4_4_;
      auVar91._8_4_ = auVar56._8_4_ + auVar58._8_4_;
      auVar91._12_4_ = auVar56._12_4_ + auVar58._12_4_;
      auVar91._16_4_ = auVar56._16_4_ + auVar58._16_4_;
      auVar91._20_4_ = auVar56._20_4_ + auVar58._20_4_;
      auVar91._24_4_ = auVar56._24_4_ + auVar58._24_4_;
      auVar91._28_4_ = auVar56._28_4_ + auVar58._28_4_;
      auVar70 = vaddps_avx512vl(auVar57,auVar59);
      auVar71 = vmulps_avx512vl(auVar91,auVar63);
      auVar71 = vfmsub231ps_avx512vl(auVar71,auVar76,auVar70);
      auVar70 = vmulps_avx512vl(auVar70,auVar77);
      auVar72 = vfmsub231ps_avx512vl(auVar70,auVar63,auVar73);
      auVar70._4_4_ = auVar76._4_4_ * auVar73._4_4_;
      auVar70._0_4_ = auVar76._0_4_ * auVar73._0_4_;
      auVar70._8_4_ = auVar76._8_4_ * auVar73._8_4_;
      auVar70._12_4_ = auVar76._12_4_ * auVar73._12_4_;
      auVar70._16_4_ = auVar76._16_4_ * auVar73._16_4_;
      auVar70._20_4_ = auVar76._20_4_ * auVar73._20_4_;
      auVar70._24_4_ = auVar76._24_4_ * auVar73._24_4_;
      auVar70._28_4_ = auVar73._28_4_;
      auVar38 = vfmsub231ps_fma(auVar70,auVar77,auVar91);
      auVar74._0_4_ = fVar94 * auVar38._0_4_;
      auVar74._4_4_ = fVar94 * auVar38._4_4_;
      auVar74._8_4_ = fVar94 * auVar38._8_4_;
      auVar74._12_4_ = fVar94 * auVar38._12_4_;
      auVar74._16_4_ = fVar94 * 0.0;
      auVar74._20_4_ = fVar94 * 0.0;
      auVar74._24_4_ = fVar94 * 0.0;
      auVar74._28_4_ = 0;
      auVar70 = vfmadd231ps_avx512vl(auVar74,auVar92,auVar72);
      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar88,auVar71);
      auVar71 = vaddps_avx512vl(auVar78,auVar60);
      auVar72 = vaddps_avx512vl(auVar58,auVar61);
      auVar73 = vaddps_avx512vl(auVar59,auVar62);
      auVar74 = vmulps_avx512vl(auVar72,auVar66);
      auVar74 = vfmsub231ps_avx512vl(auVar74,auVar65,auVar73);
      auVar73 = vmulps_avx512vl(auVar73,auVar64);
      auVar73 = vfmsub231ps_avx512vl(auVar73,auVar66,auVar71);
      auVar71 = vmulps_avx512vl(auVar71,auVar65);
      auVar72 = vfmsub231ps_avx512vl(auVar71,auVar64,auVar72);
      auVar71._4_4_ = fVar94 * auVar72._4_4_;
      auVar71._0_4_ = fVar94 * auVar72._0_4_;
      auVar71._8_4_ = fVar94 * auVar72._8_4_;
      auVar71._12_4_ = fVar94 * auVar72._12_4_;
      auVar71._16_4_ = fVar94 * auVar72._16_4_;
      auVar71._20_4_ = fVar94 * auVar72._20_4_;
      auVar71._24_4_ = fVar94 * auVar72._24_4_;
      auVar71._28_4_ = auVar72._28_4_;
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar92,auVar73);
      local_1160 = vfmadd231ps_avx512vl(auVar71,auVar88,auVar74);
      auVar75 = vaddps_avx512vl(auVar60,auVar75);
      auVar56 = vaddps_avx512vl(auVar61,auVar56);
      auVar57 = vaddps_avx512vl(auVar62,auVar57);
      auVar71 = vmulps_avx512vl(auVar56,auVar69);
      auVar71 = vfmsub231ps_avx512vl(auVar71,auVar68,auVar57);
      auVar57 = vmulps_avx512vl(auVar57,auVar67);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar69,auVar75);
      auVar60._4_4_ = auVar75._4_4_ * auVar68._4_4_;
      auVar60._0_4_ = auVar75._0_4_ * auVar68._0_4_;
      auVar60._8_4_ = auVar75._8_4_ * auVar68._8_4_;
      auVar60._12_4_ = auVar75._12_4_ * auVar68._12_4_;
      auVar60._16_4_ = auVar75._16_4_ * auVar68._16_4_;
      auVar60._20_4_ = auVar75._20_4_ * auVar68._20_4_;
      auVar60._24_4_ = auVar75._24_4_ * auVar68._24_4_;
      auVar60._28_4_ = auVar75._28_4_;
      auVar38 = vfmsub231ps_fma(auVar60,auVar67,auVar56);
      auVar75 = vmulps_avx512vl(ZEXT1632(auVar38),auVar101);
      auVar75 = vfmadd231ps_avx512vl(auVar75,auVar92,auVar57);
      auVar71 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar71);
      auVar72._0_4_ = auVar70._0_4_ + local_1160._0_4_;
      auVar72._4_4_ = auVar70._4_4_ + local_1160._4_4_;
      auVar72._8_4_ = auVar70._8_4_ + local_1160._8_4_;
      auVar72._12_4_ = auVar70._12_4_ + local_1160._12_4_;
      auVar72._16_4_ = auVar70._16_4_ + local_1160._16_4_;
      auVar72._20_4_ = auVar70._20_4_ + local_1160._20_4_;
      auVar72._24_4_ = auVar70._24_4_ + local_1160._24_4_;
      auVar72._28_4_ = auVar70._28_4_ + local_1160._28_4_;
      local_1140 = vaddps_avx512vl(auVar71,auVar72);
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75._16_4_ = 0x7fffffff;
      auVar75._20_4_ = 0x7fffffff;
      auVar75._24_4_ = 0x7fffffff;
      auVar75._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_1140,auVar75);
      auVar56._8_4_ = 0x34000000;
      auVar56._0_8_ = 0x3400000034000000;
      auVar56._12_4_ = 0x34000000;
      auVar56._16_4_ = 0x34000000;
      auVar56._20_4_ = 0x34000000;
      auVar56._24_4_ = 0x34000000;
      auVar56._28_4_ = 0x34000000;
      auVar75 = vmulps_avx512vl(local_1140,auVar56);
      auVar56 = vminps_avx512vl(auVar70,local_1160);
      auVar56 = vminps_avx512vl(auVar56,auVar71);
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar57._16_4_ = 0x80000000;
      auVar57._20_4_ = 0x80000000;
      auVar57._24_4_ = 0x80000000;
      auVar57._28_4_ = 0x80000000;
      auVar57 = vxorps_avx512vl(auVar75,auVar57);
      uVar16 = vcmpps_avx512vl(auVar56,auVar57,5);
      auVar56 = vmaxps_avx512vl(auVar70,local_1160);
      auVar56 = vmaxps_avx512vl(auVar56,auVar71);
      uVar17 = vcmpps_avx512vl(auVar56,auVar75,2);
      bVar26 = (byte)uVar16 | (byte)uVar17;
      if (bVar26 != 0) {
        auVar75 = vmulps_avx512vl(auVar65,auVar63);
        auVar56 = vmulps_avx512vl(auVar77,auVar66);
        auVar57 = vmulps_avx512vl(auVar64,auVar76);
        auVar71 = vmulps_avx512vl(auVar68,auVar66);
        auVar60 = vmulps_avx512vl(auVar64,auVar69);
        auVar61 = vmulps_avx512vl(auVar67,auVar65);
        auVar76 = vfmsub213ps_avx512vl(auVar76,auVar66,auVar75);
        auVar62 = vfmsub213ps_avx512vl(auVar63,auVar64,auVar56);
        auVar77 = vfmsub213ps_avx512vl(auVar77,auVar65,auVar57);
        auVar63 = vfmsub213ps_avx512vl(auVar69,auVar65,auVar71);
        auVar65 = vfmsub213ps_avx512vl(auVar67,auVar66,auVar60);
        auVar64 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar61);
        auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar75,auVar66);
        vandps_avx512vl(auVar71,auVar66);
        uVar37 = vcmpps_avx512vl(auVar66,auVar66,1);
        vandps_avx512vl(auVar56,auVar66);
        vandps_avx512vl(auVar60,auVar66);
        uVar35 = vcmpps_avx512vl(auVar66,auVar66,1);
        vandps_avx512vl(auVar57,auVar66);
        vandps_avx512vl(auVar61,auVar66);
        uVar29 = vcmpps_avx512vl(auVar66,auVar66,1);
        bVar10 = (bool)((byte)uVar37 & 1);
        local_1120._0_4_ = (float)((uint)bVar10 * auVar76._0_4_ | (uint)!bVar10 * auVar63._0_4_);
        bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
        local_1120._4_4_ = (float)((uint)bVar10 * auVar76._4_4_ | (uint)!bVar10 * auVar63._4_4_);
        bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
        local_1120._8_4_ = (float)((uint)bVar10 * auVar76._8_4_ | (uint)!bVar10 * auVar63._8_4_);
        bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
        local_1120._12_4_ = (float)((uint)bVar10 * auVar76._12_4_ | (uint)!bVar10 * auVar63._12_4_);
        bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
        local_1120._16_4_ = (float)((uint)bVar10 * auVar76._16_4_ | (uint)!bVar10 * auVar63._16_4_);
        bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
        local_1120._20_4_ = (float)((uint)bVar10 * auVar76._20_4_ | (uint)!bVar10 * auVar63._20_4_);
        bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
        local_1120._24_4_ = (float)((uint)bVar10 * auVar76._24_4_ | (uint)!bVar10 * auVar63._24_4_);
        bVar10 = SUB81(uVar37 >> 7,0);
        local_1120._28_4_ = (uint)bVar10 * auVar76._28_4_ | (uint)!bVar10 * auVar63._28_4_;
        bVar10 = (bool)((byte)uVar35 & 1);
        local_1100._0_4_ = (float)((uint)bVar10 * auVar62._0_4_ | (uint)!bVar10 * auVar65._0_4_);
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        local_1100._4_4_ = (float)((uint)bVar10 * auVar62._4_4_ | (uint)!bVar10 * auVar65._4_4_);
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        local_1100._8_4_ = (float)((uint)bVar10 * auVar62._8_4_ | (uint)!bVar10 * auVar65._8_4_);
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        local_1100._12_4_ = (float)((uint)bVar10 * auVar62._12_4_ | (uint)!bVar10 * auVar65._12_4_);
        bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
        local_1100._16_4_ = (float)((uint)bVar10 * auVar62._16_4_ | (uint)!bVar10 * auVar65._16_4_);
        bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
        local_1100._20_4_ = (float)((uint)bVar10 * auVar62._20_4_ | (uint)!bVar10 * auVar65._20_4_);
        bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
        local_1100._24_4_ = (float)((uint)bVar10 * auVar62._24_4_ | (uint)!bVar10 * auVar65._24_4_);
        bVar10 = SUB81(uVar35 >> 7,0);
        local_1100._28_4_ = (uint)bVar10 * auVar62._28_4_ | (uint)!bVar10 * auVar65._28_4_;
        bVar10 = (bool)((byte)uVar29 & 1);
        local_10e0 = (float)((uint)bVar10 * auVar77._0_4_ | (uint)!bVar10 * auVar64._0_4_);
        bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
        fStack_10dc = (float)((uint)bVar10 * auVar77._4_4_ | (uint)!bVar10 * auVar64._4_4_);
        bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
        fStack_10d8 = (float)((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar64._8_4_);
        bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
        fStack_10d4 = (float)((uint)bVar10 * auVar77._12_4_ | (uint)!bVar10 * auVar64._12_4_);
        bVar10 = (bool)((byte)(uVar29 >> 4) & 1);
        fStack_10d0 = (float)((uint)bVar10 * auVar77._16_4_ | (uint)!bVar10 * auVar64._16_4_);
        bVar10 = (bool)((byte)(uVar29 >> 5) & 1);
        fStack_10cc = (float)((uint)bVar10 * auVar77._20_4_ | (uint)!bVar10 * auVar64._20_4_);
        bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
        fStack_10c8 = (float)((uint)bVar10 * auVar77._24_4_ | (uint)!bVar10 * auVar64._24_4_);
        bVar10 = SUB81(uVar29 >> 7,0);
        uStack_10c4 = (uint)bVar10 * auVar77._28_4_ | (uint)!bVar10 * auVar64._28_4_;
        auVar69._4_4_ = fVar94 * fStack_10dc;
        auVar69._0_4_ = fVar94 * local_10e0;
        auVar69._8_4_ = fVar94 * fStack_10d8;
        auVar69._12_4_ = fVar94 * fStack_10d4;
        auVar69._16_4_ = fVar94 * fStack_10d0;
        auVar69._20_4_ = fVar94 * fStack_10cc;
        auVar69._24_4_ = fVar94 * fStack_10c8;
        auVar69._28_4_ = fVar94;
        auVar38 = vfmadd213ps_fma(auVar92,local_1100,auVar69);
        auVar38 = vfmadd213ps_fma(auVar88,local_1120,ZEXT1632(auVar38));
        auVar77 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                     CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                              CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                       auVar38._0_4_ + auVar38._0_4_))));
        auVar93._0_4_ = auVar59._0_4_ * local_10e0;
        auVar93._4_4_ = auVar59._4_4_ * fStack_10dc;
        auVar93._8_4_ = auVar59._8_4_ * fStack_10d8;
        auVar93._12_4_ = auVar59._12_4_ * fStack_10d4;
        auVar93._16_4_ = auVar59._16_4_ * fStack_10d0;
        auVar93._20_4_ = auVar59._20_4_ * fStack_10cc;
        auVar93._24_4_ = auVar59._24_4_ * fStack_10c8;
        auVar93._28_4_ = 0;
        auVar38 = vfmadd213ps_fma(auVar58,local_1100,auVar93);
        auVar39 = vfmadd213ps_fma(auVar78,local_1120,ZEXT1632(auVar38));
        auVar75 = vrcp14ps_avx512vl(auVar77);
        auVar78._8_4_ = 0x3f800000;
        auVar78._0_8_ = 0x3f8000003f800000;
        auVar78._12_4_ = 0x3f800000;
        auVar78._16_4_ = 0x3f800000;
        auVar78._20_4_ = 0x3f800000;
        auVar78._24_4_ = 0x3f800000;
        auVar78._28_4_ = 0x3f800000;
        auVar78 = vfnmadd213ps_avx512vl(auVar75,auVar77,auVar78);
        auVar38 = vfmadd132ps_fma(auVar78,auVar75,auVar75);
        uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar96._4_4_ = uVar95;
        auVar96._0_4_ = uVar95;
        auVar96._8_4_ = uVar95;
        auVar96._12_4_ = uVar95;
        auVar96._16_4_ = uVar95;
        auVar96._20_4_ = uVar95;
        auVar96._24_4_ = uVar95;
        auVar96._28_4_ = uVar95;
        auVar109 = ZEXT3264(auVar96);
        local_1060 = ZEXT1632(CONCAT412(auVar38._12_4_ * (auVar39._12_4_ + auVar39._12_4_),
                                        CONCAT48(auVar38._8_4_ * (auVar39._8_4_ + auVar39._8_4_),
                                                 CONCAT44(auVar38._4_4_ *
                                                          (auVar39._4_4_ + auVar39._4_4_),
                                                          auVar38._0_4_ *
                                                          (auVar39._0_4_ + auVar39._0_4_)))));
        auVar84 = ZEXT3264(local_1060);
        uVar16 = vcmpps_avx512vl(local_1060,auVar96,2);
        uVar95 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar76._4_4_ = uVar95;
        auVar76._0_4_ = uVar95;
        auVar76._8_4_ = uVar95;
        auVar76._12_4_ = uVar95;
        auVar76._16_4_ = uVar95;
        auVar76._20_4_ = uVar95;
        auVar76._24_4_ = uVar95;
        auVar76._28_4_ = uVar95;
        uVar17 = vcmpps_avx512vl(local_1060,auVar76,0xd);
        bVar26 = (byte)uVar16 & (byte)uVar17 & bVar26;
        if (bVar26 != 0) {
          uVar37 = vcmpps_avx512vl(auVar77,_DAT_01f7b000,4);
          uVar37 = bVar26 & uVar37;
          local_10c0 = (byte)uVar37;
          if (local_10c0 != 0) {
            local_1180 = auVar70;
            local_fe0 = 0xf0;
            auVar19._8_4_ = 0x219392ef;
            auVar19._0_8_ = 0x219392ef219392ef;
            auVar19._12_4_ = 0x219392ef;
            auVar19._16_4_ = 0x219392ef;
            auVar19._20_4_ = 0x219392ef;
            auVar19._24_4_ = 0x219392ef;
            auVar19._28_4_ = 0x219392ef;
            uVar35 = vcmpps_avx512vl(local_1140,auVar19,5);
            auVar75 = vrcp14ps_avx512vl(local_1140);
            auVar89._8_4_ = 0x3f800000;
            auVar89._0_8_ = 0x3f8000003f800000;
            auVar89._12_4_ = 0x3f800000;
            auVar89._16_4_ = 0x3f800000;
            auVar89._20_4_ = 0x3f800000;
            auVar89._24_4_ = 0x3f800000;
            auVar89._28_4_ = 0x3f800000;
            auVar38 = vfnmadd213ps_fma(local_1140,auVar75,auVar89);
            auVar78 = vfmadd132ps_avx512vl(ZEXT1632(auVar38),auVar75,auVar75);
            fVar100 = (float)((uint)((byte)uVar35 & 1) * auVar78._0_4_);
            fVar94 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar78._4_4_);
            fVar102 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar78._8_4_);
            fVar99 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar78._12_4_);
            fVar98 = (float)((uint)((byte)(uVar35 >> 4) & 1) * auVar78._16_4_);
            fVar97 = (float)((uint)((byte)(uVar35 >> 5) & 1) * auVar78._20_4_);
            fVar105 = (float)((uint)((byte)(uVar35 >> 6) & 1) * auVar78._24_4_);
            auVar20._4_4_ = fVar94 * auVar70._4_4_;
            auVar20._0_4_ = fVar100 * auVar70._0_4_;
            auVar20._8_4_ = fVar102 * auVar70._8_4_;
            auVar20._12_4_ = fVar99 * auVar70._12_4_;
            auVar20._16_4_ = fVar98 * auVar70._16_4_;
            auVar20._20_4_ = fVar97 * auVar70._20_4_;
            auVar20._24_4_ = fVar105 * auVar70._24_4_;
            auVar20._28_4_ = auVar70._28_4_;
            auVar78 = vminps_avx(auVar20,auVar89);
            auVar21._4_4_ = fVar94 * local_1160._4_4_;
            auVar21._0_4_ = fVar100 * local_1160._0_4_;
            auVar21._8_4_ = fVar102 * local_1160._8_4_;
            auVar21._12_4_ = fVar99 * local_1160._12_4_;
            auVar21._16_4_ = fVar98 * local_1160._16_4_;
            auVar21._20_4_ = fVar97 * local_1160._20_4_;
            auVar21._24_4_ = fVar105 * local_1160._24_4_;
            auVar21._28_4_ = auVar75._28_4_;
            auVar75 = vminps_avx(auVar21,auVar89);
            auVar77 = vsubps_avx(auVar89,auVar78);
            auVar76 = vsubps_avx(auVar89,auVar75);
            local_1080 = vblendps_avx(auVar75,auVar77,0xf0);
            local_10a0 = vblendps_avx(auVar78,auVar76,0xf0);
            fVar94 = (float)DAT_01fbac00;
            fVar100 = DAT_01fbac00._4_4_;
            fVar105 = DAT_01fbac00._8_4_;
            fVar97 = DAT_01fbac00._12_4_;
            fVar98 = DAT_01fbac00._16_4_;
            fVar99 = DAT_01fbac00._20_4_;
            fVar102 = DAT_01fbac00._24_4_;
            local_1040[0] = local_1120._0_4_ * fVar94;
            local_1040[1] = local_1120._4_4_ * fVar100;
            local_1040[2] = local_1120._8_4_ * fVar105;
            local_1040[3] = local_1120._12_4_ * fVar97;
            fStack_1030 = local_1120._16_4_ * fVar98;
            fStack_102c = local_1120._20_4_ * fVar99;
            fStack_1028 = local_1120._24_4_ * fVar102;
            uStack_1024 = local_1120._28_4_;
            local_1020[0] = local_1100._0_4_ * fVar94;
            local_1020[1] = local_1100._4_4_ * fVar100;
            local_1020[2] = local_1100._8_4_ * fVar105;
            local_1020[3] = local_1100._12_4_ * fVar97;
            fStack_1010 = local_1100._16_4_ * fVar98;
            fStack_100c = local_1100._20_4_ * fVar99;
            fStack_1008 = local_1100._24_4_ * fVar102;
            uStack_1004 = local_1100._28_4_;
            local_1000[0] = local_10e0 * fVar94;
            local_1000[1] = fStack_10dc * fVar100;
            local_1000[2] = fStack_10d8 * fVar105;
            local_1000[3] = fStack_10d4 * fVar97;
            fStack_ff0 = fStack_10d0 * fVar98;
            fStack_fec = fStack_10cc * fVar99;
            fStack_fe8 = fStack_10c8 * fVar102;
            uStack_fe4 = uStack_10c4;
            auVar81._8_4_ = 0x7f800000;
            auVar81._0_8_ = 0x7f8000007f800000;
            auVar81._12_4_ = 0x7f800000;
            auVar81._16_4_ = 0x7f800000;
            auVar81._20_4_ = 0x7f800000;
            auVar81._24_4_ = 0x7f800000;
            auVar81._28_4_ = 0x7f800000;
            auVar78 = vblendmps_avx512vl(auVar81,local_1060);
            auVar79._0_4_ =
                 (uint)(local_10c0 & 1) * auVar78._0_4_ | (uint)!(bool)(local_10c0 & 1) * 0x7f800000
            ;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar79._4_4_ = (uint)bVar10 * auVar78._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar79._8_4_ = (uint)bVar10 * auVar78._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar79._12_4_ = (uint)bVar10 * auVar78._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar79._16_4_ = (uint)bVar10 * auVar78._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar79._20_4_ = (uint)bVar10 * auVar78._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar79._24_4_ = (uint)bVar10 * auVar78._24_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = SUB81(uVar37 >> 7,0);
            auVar79._28_4_ = (uint)bVar10 * auVar78._28_4_ | (uint)!bVar10 * 0x7f800000;
            auVar78 = vshufps_avx(auVar79,auVar79,0xb1);
            auVar78 = vminps_avx(auVar79,auVar78);
            auVar75 = vshufpd_avx(auVar78,auVar78,5);
            auVar78 = vminps_avx(auVar78,auVar75);
            auVar75 = vpermpd_avx2(auVar78,0x4e);
            auVar78 = vminps_avx(auVar78,auVar75);
            uVar16 = vcmpps_avx512vl(auVar79,auVar78,0);
            uVar27 = (uint)uVar37;
            if (((byte)uVar16 & local_10c0) != 0) {
              uVar27 = (uint)((byte)uVar16 & local_10c0);
            }
            uVar28 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar28 = uVar28 + 1;
            }
            do {
              uVar32 = uVar28 & 0xff;
              uVar27 = *(uint *)((long)&local_fc0 + (ulong)uVar32 * 4);
              local_1380 = (pSVar3->geometries).items[uVar27].ptr;
              if ((local_1380->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar37 = (ulong)(byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar37);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_1380->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar37 = (ulong)(uVar32 << 2);
                  uVar95 = *(undefined4 *)(local_10a0 + uVar37);
                  uVar2 = *(undefined4 *)(local_1080 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1040 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1020 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_1000 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar95;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1240 + uVar37)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar27;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar35 = (ulong)(uVar32 * 4);
                uVar95 = *(undefined4 *)(local_10a0 + uVar35);
                local_11e0._4_4_ = uVar95;
                local_11e0._0_4_ = uVar95;
                local_11e0._8_4_ = uVar95;
                local_11e0._12_4_ = uVar95;
                local_11d0 = *(undefined4 *)(local_1080 + uVar35);
                local_11b0 = vpbroadcastd_avx512vl();
                uVar95 = *(undefined4 *)((long)&local_1240 + uVar35);
                local_11c0._4_4_ = uVar95;
                local_11c0._0_4_ = uVar95;
                local_11c0._8_4_ = uVar95;
                local_11c0._12_4_ = uVar95;
                uVar95 = *(undefined4 *)((long)local_1040 + uVar35);
                uVar2 = *(undefined4 *)((long)local_1020 + uVar35);
                local_1200._4_4_ = uVar2;
                local_1200._0_4_ = uVar2;
                local_1200._8_4_ = uVar2;
                local_1200._12_4_ = uVar2;
                uVar2 = *(undefined4 *)((long)local_1000 + uVar35);
                local_11f0._4_4_ = uVar2;
                local_11f0._0_4_ = uVar2;
                local_11f0._8_4_ = uVar2;
                local_11f0._12_4_ = uVar2;
                local_1210[0] = (RTCHitN)(char)uVar95;
                local_1210[1] = (RTCHitN)(char)((uint)uVar95 >> 8);
                local_1210[2] = (RTCHitN)(char)((uint)uVar95 >> 0x10);
                local_1210[3] = (RTCHitN)(char)((uint)uVar95 >> 0x18);
                local_1210[4] = (RTCHitN)(char)uVar95;
                local_1210[5] = (RTCHitN)(char)((uint)uVar95 >> 8);
                local_1210[6] = (RTCHitN)(char)((uint)uVar95 >> 0x10);
                local_1210[7] = (RTCHitN)(char)((uint)uVar95 >> 0x18);
                local_1210[8] = (RTCHitN)(char)uVar95;
                local_1210[9] = (RTCHitN)(char)((uint)uVar95 >> 8);
                local_1210[10] = (RTCHitN)(char)((uint)uVar95 >> 0x10);
                local_1210[0xb] = (RTCHitN)(char)((uint)uVar95 >> 0x18);
                local_1210[0xc] = (RTCHitN)(char)uVar95;
                local_1210[0xd] = (RTCHitN)(char)((uint)uVar95 >> 8);
                local_1210[0xe] = (RTCHitN)(char)((uint)uVar95 >> 0x10);
                local_1210[0xf] = (RTCHitN)(char)((uint)uVar95 >> 0x18);
                uStack_11cc = local_11d0;
                uStack_11c8 = local_11d0;
                uStack_11c4 = local_11d0;
                vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
                uStack_119c = context->user->instID[0];
                local_11a0 = uStack_119c;
                uStack_1198 = uStack_119c;
                uStack_1194 = uStack_119c;
                uStack_1190 = context->user->instPrimID[0];
                uStack_118c = uStack_1190;
                uStack_1188 = uStack_1190;
                uStack_1184 = uStack_1190;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar35);
                local_1390 = local_12d0;
                local_1360.valid = (int *)local_1390;
                local_1360.geometryUserPtr = local_1380->userPtr;
                local_1360.context = context->user;
                local_1360.hit = local_1210;
                local_1360.N = 4;
                local_1260 = auVar84._0_32_;
                local_1280 = auVar109._0_32_;
                local_1360.ray = (RTCRayN *)ray;
                if (local_1380->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_1380->intersectionFilterN)(&local_1360);
                  auVar109 = ZEXT3264(local_1280);
                  auVar84 = ZEXT3264(local_1260);
                  auVar115 = ZEXT1664(local_1330);
                  auVar114 = ZEXT1664(local_1320);
                  auVar113 = ZEXT1664(local_1310);
                  auVar112 = ZEXT1664(local_1300);
                  auVar111 = ZEXT1664(local_12f0);
                  auVar110 = ZEXT1664(local_12e0);
                }
                uVar35 = vptestmd_avx512vl(local_1390,local_1390);
                if ((uVar35 & 0xf) == 0) {
LAB_01cd6461:
                  *(int *)(ray + k * 4 + 0x80) = auVar109._0_4_;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_1380->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var9)(&local_1360);
                    auVar109 = ZEXT3264(local_1280);
                    auVar84 = ZEXT3264(local_1260);
                    auVar115 = ZEXT1664(local_1330);
                    auVar114 = ZEXT1664(local_1320);
                    auVar113 = ZEXT1664(local_1310);
                    auVar112 = ZEXT1664(local_1300);
                    auVar111 = ZEXT1664(local_12f0);
                    auVar110 = ZEXT1664(local_12e0);
                  }
                  uVar35 = vptestmd_avx512vl(local_1390,local_1390);
                  uVar35 = uVar35 & 0xf;
                  bVar26 = (byte)uVar35;
                  if (bVar26 == 0) goto LAB_01cd6461;
                  iVar1 = *(int *)(local_1360.hit + 4);
                  iVar22 = *(int *)(local_1360.hit + 8);
                  iVar23 = *(int *)(local_1360.hit + 0xc);
                  bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar12 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_1360.ray + 0xc0) =
                       (uint)(bVar26 & 1) * *(int *)local_1360.hit |
                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_1360.ray + 0xc0);
                  *(uint *)(local_1360.ray + 0xc4) =
                       (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_1360.ray + 0xc4);
                  *(uint *)(local_1360.ray + 200) =
                       (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1360.ray + 200);
                  *(uint *)(local_1360.ray + 0xcc) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(local_1360.ray + 0xcc);
                  iVar1 = *(int *)(local_1360.hit + 0x14);
                  iVar22 = *(int *)(local_1360.hit + 0x18);
                  iVar23 = *(int *)(local_1360.hit + 0x1c);
                  bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar12 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_1360.ray + 0xd0) =
                       (uint)(bVar26 & 1) * *(int *)(local_1360.hit + 0x10) |
                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_1360.ray + 0xd0);
                  *(uint *)(local_1360.ray + 0xd4) =
                       (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_1360.ray + 0xd4);
                  *(uint *)(local_1360.ray + 0xd8) =
                       (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1360.ray + 0xd8);
                  *(uint *)(local_1360.ray + 0xdc) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(local_1360.ray + 0xdc);
                  iVar1 = *(int *)(local_1360.hit + 0x24);
                  iVar22 = *(int *)(local_1360.hit + 0x28);
                  iVar23 = *(int *)(local_1360.hit + 0x2c);
                  bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar12 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_1360.ray + 0xe0) =
                       (uint)(bVar26 & 1) * *(int *)(local_1360.hit + 0x20) |
                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_1360.ray + 0xe0);
                  *(uint *)(local_1360.ray + 0xe4) =
                       (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_1360.ray + 0xe4);
                  *(uint *)(local_1360.ray + 0xe8) =
                       (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1360.ray + 0xe8);
                  *(uint *)(local_1360.ray + 0xec) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(local_1360.ray + 0xec);
                  iVar1 = *(int *)(local_1360.hit + 0x34);
                  iVar22 = *(int *)(local_1360.hit + 0x38);
                  iVar23 = *(int *)(local_1360.hit + 0x3c);
                  bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                  bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                  bVar12 = SUB81(uVar35 >> 3,0);
                  *(uint *)(local_1360.ray + 0xf0) =
                       (uint)(bVar26 & 1) * *(int *)(local_1360.hit + 0x30) |
                       (uint)!(bool)(bVar26 & 1) * *(int *)(local_1360.ray + 0xf0);
                  *(uint *)(local_1360.ray + 0xf4) =
                       (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_1360.ray + 0xf4);
                  *(uint *)(local_1360.ray + 0xf8) =
                       (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1360.ray + 0xf8);
                  *(uint *)(local_1360.ray + 0xfc) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(local_1360.ray + 0xfc);
                  auVar38 = *(undefined1 (*) [16])(local_1360.ray + 0x100);
                  auVar55._0_4_ =
                       (uint)(bVar26 & 1) * *(int *)(local_1360.hit + 0x40) |
                       (uint)!(bool)(bVar26 & 1) * auVar38._0_4_;
                  bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                  auVar55._4_4_ =
                       (uint)bVar10 * *(int *)(local_1360.hit + 0x44) |
                       (uint)!bVar10 * auVar38._4_4_;
                  bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                  auVar55._8_4_ =
                       (uint)bVar10 * *(int *)(local_1360.hit + 0x48) |
                       (uint)!bVar10 * auVar38._8_4_;
                  bVar10 = SUB81(uVar35 >> 3,0);
                  auVar55._12_4_ =
                       (uint)bVar10 * *(int *)(local_1360.hit + 0x4c) |
                       (uint)!bVar10 * auVar38._12_4_;
                  *(undefined1 (*) [16])(local_1360.ray + 0x100) = auVar55;
                  auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1360.hit + 0x50));
                  *(undefined1 (*) [16])(local_1360.ray + 0x110) = auVar38;
                  auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1360.hit + 0x60));
                  *(undefined1 (*) [16])(local_1360.ray + 0x120) = auVar38;
                  auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1360.hit + 0x70));
                  *(undefined1 (*) [16])(local_1360.ray + 0x130) = auVar38;
                  auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1360.hit + 0x80));
                  *(undefined1 (*) [16])(local_1360.ray + 0x140) = auVar38;
                  auVar109 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                uVar95 = auVar109._0_4_;
                auVar83._4_4_ = uVar95;
                auVar83._0_4_ = uVar95;
                auVar83._8_4_ = uVar95;
                auVar83._12_4_ = uVar95;
                auVar83._16_4_ = uVar95;
                auVar83._20_4_ = uVar95;
                auVar83._24_4_ = uVar95;
                auVar83._28_4_ = uVar95;
                uVar35 = vcmpps_avx512vl(auVar84._0_32_,auVar83,2);
                uVar37 = (byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar37) & uVar35;
              }
              bVar26 = (byte)uVar37;
              if (bVar26 == 0) break;
              auVar82._8_4_ = 0x7f800000;
              auVar82._0_8_ = 0x7f8000007f800000;
              auVar82._12_4_ = 0x7f800000;
              auVar82._16_4_ = 0x7f800000;
              auVar82._20_4_ = 0x7f800000;
              auVar82._24_4_ = 0x7f800000;
              auVar82._28_4_ = 0x7f800000;
              auVar78 = vblendmps_avx512vl(auVar82,auVar84._0_32_);
              auVar80._0_4_ =
                   (uint)(bVar26 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar80._4_4_ = (uint)bVar10 * auVar78._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar80._8_4_ = (uint)bVar10 * auVar78._8_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
              auVar80._12_4_ = (uint)bVar10 * auVar78._12_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
              auVar80._16_4_ = (uint)bVar10 * auVar78._16_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
              auVar80._20_4_ = (uint)bVar10 * auVar78._20_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
              auVar80._24_4_ = (uint)bVar10 * auVar78._24_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = SUB81(uVar37 >> 7,0);
              auVar80._28_4_ = (uint)bVar10 * auVar78._28_4_ | (uint)!bVar10 * 0x7f800000;
              auVar78 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar78 = vminps_avx(auVar80,auVar78);
              auVar75 = vshufpd_avx(auVar78,auVar78,5);
              auVar78 = vminps_avx(auVar78,auVar75);
              auVar75 = vpermpd_avx2(auVar78,0x4e);
              auVar78 = vminps_avx(auVar78,auVar75);
              uVar16 = vcmpps_avx512vl(auVar80,auVar78,0);
              bVar26 = (byte)uVar16 & bVar26;
              uVar27 = (uint)uVar37;
              if (bVar26 != 0) {
                uVar27 = (uint)bVar26;
              }
              uVar28 = 0;
              for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                uVar28 = uVar28 + 1;
              }
            } while( true );
          }
        }
      }
      auVar109 = ZEXT1664(local_12c0);
      fVar94 = local_1290;
      fVar97 = fStack_128c;
      fVar98 = fStack_1288;
      fVar99 = fStack_1284;
      fVar100 = local_12a0;
      fVar102 = fStack_129c;
      fVar103 = fStack_1298;
      fVar104 = fStack_1294;
      fVar105 = local_12b0;
      fVar106 = fStack_12ac;
      fVar107 = fStack_12a8;
      fVar108 = fStack_12a4;
    }
    uVar95 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar84 = ZEXT1664(CONCAT412(uVar95,CONCAT48(uVar95,CONCAT44(uVar95,uVar95))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }